

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

ECDSA_SIG * d2i_ECDSA_SIG(ECDSA_SIG **sig,uchar **pp,long len)

{
  uint8_t *puVar1;
  ECDSA_SIG *ret;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  ECDSA_SIG **out_local;
  
  if (len < 0) {
    out_local = (ECDSA_SIG **)0x0;
  }
  else {
    cbs.len = len;
    CBS_init((CBS *)&ret,*pp,len);
    out_local = (ECDSA_SIG **)ECDSA_SIG_parse((CBS *)&ret);
    if ((ECDSA_SIG *)out_local == (ECDSA_SIG *)0x0) {
      out_local = (ECDSA_SIG **)0x0;
    }
    else {
      if (sig != (ECDSA_SIG **)0x0) {
        ECDSA_SIG_free(*sig);
        *sig = (ECDSA_SIG *)out_local;
      }
      puVar1 = CBS_data((CBS *)&ret);
      *pp = puVar1;
    }
  }
  return (ECDSA_SIG *)out_local;
}

Assistant:

ECDSA_SIG *d2i_ECDSA_SIG(ECDSA_SIG **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  ECDSA_SIG *ret = ECDSA_SIG_parse(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    ECDSA_SIG_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}